

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O0

int Saig_ManBmcTerSimCount01Po(Aig_Man_t *p,uint *pInfo)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  int local_28;
  int local_24;
  int Counter;
  int i;
  Aig_Obj_t *pObj;
  uint *pInfo_local;
  Aig_Man_t *p_local;
  
  local_28 = 0;
  for (local_24 = 0; iVar1 = Saig_ManPoNum(p), local_24 < iVar1; local_24 = local_24 + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_24);
    iVar1 = Saig_ManBmcSimInfoGet(pInfo,pObj_00);
    local_28 = (uint)(iVar1 != 3) + local_28;
  }
  return local_28;
}

Assistant:

int Saig_ManBmcTerSimCount01Po( Aig_Man_t * p, unsigned * pInfo )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    Saig_ManForEachPo( p, pObj, i )
        Counter += (Saig_ManBmcSimInfoGet(pInfo, pObj) != SAIG_TER_UND);
    return Counter;
}